

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-attr.cpp
# Opt level: O0

bool __thiscall yactfr::internal::TsdlAttr::boolEquiv(TsdlAttr *this)

{
  TextLocation loc;
  bool bVar1;
  ostream *poVar2;
  TextLocation local_1d8;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream ss;
  TsdlAttr *this_local;
  
  if (this->kind == UInt) {
    if (this->uintVal == 1) {
      this_local._7_1_ = true;
    }
    else {
      if (this->uintVal != 0) goto LAB_005d08f6;
      this_local._7_1_ = false;
    }
  }
  else {
    if (this->kind != Ident) {
LAB_005d08f6:
      std::__cxx11::ostringstream::ostringstream(local_190);
      poVar2 = std::operator<<((ostream *)local_190,
                               "Expecting `0`, `false`, `FALSE`, `1`, `true`, or `TRUE` for `");
      poVar2 = std::operator<<(poVar2,(string *)&this->name);
      std::operator<<(poVar2,"` attribute.");
      std::__cxx11::ostringstream::str();
      valTextLoc(&local_1d8,this);
      loc._lineNumber = local_1d8._lineNumber;
      loc._offset = local_1d8._offset;
      loc._colNumber = local_1d8._colNumber;
      throwTextParseError(&local_1c0,loc);
    }
    bVar1 = std::operator==(&this->strVal,"true");
    if ((bVar1) || (bVar1 = std::operator==(&this->strVal,"TRUE"), bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = std::operator==(&this->strVal,"false");
      if ((!bVar1) && (bVar1 = std::operator==(&this->strVal,"FALSE"), !bVar1)) goto LAB_005d08f6;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TsdlAttr::boolEquiv() const
{
    switch (kind) {
    case Kind::UInt:
        if (uintVal == 1) {
            return true;
        } else if (uintVal == 0) {
            return false;
        }
        break;

    case Kind::Ident:
        if (strVal == "true" || strVal == "TRUE") {
            return true;
        } else if (strVal == "false" || strVal == "FALSE") {
            return false;
        }

    default:
        break;
    }

    std::ostringstream ss;

    ss << "Expecting `0`, `false`, `FALSE`, `1`, `true`, or `TRUE` for `" <<
          name << "` attribute.";
    throwTextParseError(ss.str(), this->valTextLoc());
}